

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_3_2::RgbaYca::decimateChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  Rgba *pRVar1;
  Rgba *pRVar2;
  Rgba *pRVar3;
  Rgba *pRVar4;
  Rgba *pRVar5;
  Rgba *pRVar6;
  Rgba *pRVar7;
  Rgba *pRVar8;
  Rgba *pRVar9;
  Rgba *pRVar10;
  Rgba *pRVar11;
  Rgba *pRVar12;
  Rgba *pRVar13;
  Rgba *pRVar14;
  Rgba *pRVar15;
  Rgba *pRVar16;
  char cVar17;
  long lVar18;
  uint16_t uVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  ushort uVar23;
  float fVar24;
  
  lVar18 = _imath_half_to_float_table;
  if (0 < n) {
    pRVar1 = ycaIn[0xd];
    uVar21 = 0;
    do {
      if ((uVar21 & 1) == 0) {
        pRVar2 = *ycaIn;
        pRVar3 = ycaIn[2];
        pRVar4 = ycaIn[4];
        pRVar5 = ycaIn[6];
        pRVar6 = ycaIn[8];
        pRVar7 = ycaIn[10];
        pRVar8 = ycaIn[0xc];
        pRVar9 = ycaIn[0xd];
        pRVar10 = ycaIn[0xe];
        pRVar11 = ycaIn[0x10];
        pRVar12 = ycaIn[0x12];
        pRVar13 = ycaIn[0x14];
        pRVar14 = ycaIn[0x16];
        pRVar15 = ycaIn[0x18];
        pRVar16 = ycaIn[0x1a];
        fVar24 = *(float *)(lVar18 + (ulong)pRVar16[uVar21].r._h * 4) * 0.001064 +
                 *(float *)(lVar18 + (ulong)pRVar15[uVar21].r._h * 4) * -0.003771 +
                 *(float *)(lVar18 + (ulong)pRVar14[uVar21].r._h * 4) * 0.009801 +
                 *(float *)(lVar18 + (ulong)pRVar13[uVar21].r._h * 4) * -0.021586 +
                 *(float *)(lVar18 + (ulong)pRVar12[uVar21].r._h * 4) * 0.043978 +
                 *(float *)(lVar18 + (ulong)pRVar11[uVar21].r._h * 4) * -0.093067 +
                 *(float *)(lVar18 + (ulong)pRVar10[uVar21].r._h * 4) * 0.313659 +
                 *(float *)(lVar18 + (ulong)pRVar9[uVar21].r._h * 4) * 0.499846 +
                 *(float *)(lVar18 + (ulong)pRVar8[uVar21].r._h * 4) * 0.313659 +
                 *(float *)(lVar18 + (ulong)pRVar7[uVar21].r._h * 4) * -0.093067 +
                 *(float *)(lVar18 + (ulong)pRVar6[uVar21].r._h * 4) * 0.043978 +
                 *(float *)(lVar18 + (ulong)pRVar5[uVar21].r._h * 4) * -0.021586 +
                 *(float *)(lVar18 + (ulong)pRVar4[uVar21].r._h * 4) * 0.009801 +
                 *(float *)(lVar18 + (ulong)pRVar2[uVar21].r._h * 4) * 0.001064 +
                 *(float *)(lVar18 + (ulong)pRVar3[uVar21].r._h * 4) * -0.003771;
        fVar22 = ABS(fVar24);
        uVar23 = (ushort)((uint)fVar24 >> 0x10) & 0x8000;
        if ((uint)fVar22 < 0x38800000) {
          if ((0x33000000 < (uint)fVar22) &&
             (uVar20 = (uint)fVar22 & 0x7fffff | 0x800000, cVar17 = (char)((uint)fVar22 >> 0x17),
             uVar23 = uVar23 | (ushort)(uVar20 >> (0x7eU - cVar17 & 0x1f)),
             0x80000000 < uVar20 << (cVar17 + 0xa2U & 0x1f))) {
            uVar23 = uVar23 + 1;
          }
        }
        else if ((uint)fVar22 < 0x7f800000) {
          if ((uint)fVar22 < 0x477ff000) {
            uVar23 = (ushort)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >>
                             0xd) | uVar23;
          }
          else {
            uVar23 = uVar23 | 0x7c00;
          }
        }
        else {
          uVar23 = uVar23 | 0x7c00;
          if (fVar22 != INFINITY) {
            uVar20 = (uint)fVar22 >> 0xd & 0x3ff;
            uVar23 = uVar23 | (ushort)uVar20 | (ushort)(uVar20 == 0);
          }
        }
        ycaOut[uVar21].r._h = uVar23;
        fVar24 = *(float *)(lVar18 + (ulong)pRVar16[uVar21].b._h * 4) * 0.001064 +
                 *(float *)(lVar18 + (ulong)pRVar15[uVar21].b._h * 4) * -0.003771 +
                 *(float *)(lVar18 + (ulong)pRVar14[uVar21].b._h * 4) * 0.009801 +
                 *(float *)(lVar18 + (ulong)pRVar13[uVar21].b._h * 4) * -0.021586 +
                 *(float *)(lVar18 + (ulong)pRVar12[uVar21].b._h * 4) * 0.043978 +
                 *(float *)(lVar18 + (ulong)pRVar11[uVar21].b._h * 4) * -0.093067 +
                 *(float *)(lVar18 + (ulong)pRVar10[uVar21].b._h * 4) * 0.313659 +
                 *(float *)(lVar18 + (ulong)pRVar9[uVar21].b._h * 4) * 0.499846 +
                 *(float *)(lVar18 + (ulong)pRVar8[uVar21].b._h * 4) * 0.313659 +
                 *(float *)(lVar18 + (ulong)pRVar7[uVar21].b._h * 4) * -0.093067 +
                 *(float *)(lVar18 + (ulong)pRVar6[uVar21].b._h * 4) * 0.043978 +
                 *(float *)(lVar18 + (ulong)pRVar5[uVar21].b._h * 4) * -0.021586 +
                 *(float *)(lVar18 + (ulong)pRVar4[uVar21].b._h * 4) * 0.009801 +
                 *(float *)(lVar18 + (ulong)pRVar2[uVar21].b._h * 4) * 0.001064 +
                 *(float *)(lVar18 + (ulong)pRVar3[uVar21].b._h * 4) * -0.003771;
        fVar22 = ABS(fVar24);
        uVar19 = (ushort)((uint)fVar24 >> 0x10) & 0x8000;
        if ((uint)fVar22 < 0x38800000) {
          if ((0x33000000 < (uint)fVar22) &&
             (uVar20 = (uint)fVar22 & 0x7fffff | 0x800000, cVar17 = (char)((uint)fVar22 >> 0x17),
             uVar19 = uVar19 | (ushort)(uVar20 >> (0x7eU - cVar17 & 0x1f)),
             0x80000000 < uVar20 << (cVar17 + 0xa2U & 0x1f))) {
            uVar19 = uVar19 + 1;
          }
        }
        else if ((uint)fVar22 < 0x7f800000) {
          if ((uint)fVar22 < 0x477ff000) {
            uVar19 = (ushort)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >>
                             0xd) | uVar19;
          }
          else {
            uVar19 = uVar19 | 0x7c00;
          }
        }
        else {
          uVar19 = uVar19 | 0x7c00;
          if (fVar22 != INFINITY) {
            uVar20 = (uint)fVar22 >> 0xd & 0x3ff;
            uVar19 = uVar19 | (ushort)uVar20 | (ushort)(uVar20 == 0);
          }
        }
        ycaOut[uVar21].b._h = uVar19;
      }
      ycaOut[uVar21].g._h = pRVar1[uVar21].g._h;
      ycaOut[uVar21].a._h = pRVar1[uVar21].a._h;
      uVar21 = uVar21 + 1;
    } while ((uint)n != uVar21);
  }
  return;
}

Assistant:

void
decimateChromaVert (int n, const Rgba* const ycaIn[N], Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        if ((i & 1) == 0)
        {
            ycaOut[i].r =
                ycaIn[0][i].r * 0.001064f + ycaIn[2][i].r * -0.003771f +
                ycaIn[4][i].r * 0.009801f + ycaIn[6][i].r * -0.021586f +
                ycaIn[8][i].r * 0.043978f + ycaIn[10][i].r * -0.093067f +
                ycaIn[12][i].r * 0.313659f + ycaIn[13][i].r * 0.499846f +
                ycaIn[14][i].r * 0.313659f + ycaIn[16][i].r * -0.093067f +
                ycaIn[18][i].r * 0.043978f + ycaIn[20][i].r * -0.021586f +
                ycaIn[22][i].r * 0.009801f + ycaIn[24][i].r * -0.003771f +
                ycaIn[26][i].r * 0.001064f;

            ycaOut[i].b =
                ycaIn[0][i].b * 0.001064f + ycaIn[2][i].b * -0.003771f +
                ycaIn[4][i].b * 0.009801f + ycaIn[6][i].b * -0.021586f +
                ycaIn[8][i].b * 0.043978f + ycaIn[10][i].b * -0.093067f +
                ycaIn[12][i].b * 0.313659f + ycaIn[13][i].b * 0.499846f +
                ycaIn[14][i].b * 0.313659f + ycaIn[16][i].b * -0.093067f +
                ycaIn[18][i].b * 0.043978f + ycaIn[20][i].b * -0.021586f +
                ycaIn[22][i].b * 0.009801f + ycaIn[24][i].b * -0.003771f +
                ycaIn[26][i].b * 0.001064f;
        }

        ycaOut[i].g = ycaIn[13][i].g;
        ycaOut[i].a = ycaIn[13][i].a;
    }
}